

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v11::detail::format_handler<char>::on_format_specs
          (format_handler<char> *this,int id,char *begin,char *end)

{
  undefined1 x [16];
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 x_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  loc_value value_03;
  loc_value value_04;
  loc_value value_05;
  loc_value value_06;
  loc_value value_07;
  write_int_arg<unsigned___int128> arg_00;
  loc_value value_08;
  write_int_arg<unsigned___int128> arg_01;
  custom_value<fmt::v11::context> custom;
  detail *this_00;
  uint128_opt *this_01;
  bool bVar1;
  type arg_type;
  arg_id_kind aVar2;
  sign sVar3;
  detail *siglen;
  uint128_opt *siglen_00;
  size_t *psVar4;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *extraout_RDX_05;
  uchar *extraout_RDX_06;
  undefined8 extraout_RDX_07;
  uchar *extraout_RDX_08;
  uchar *extraout_RDX_09;
  undefined8 extraout_RDX_10;
  uchar *extraout_RDX_11;
  uchar *extraout_RDX_12;
  uchar *puVar5;
  basic_appender<char> bVar6;
  locale_ref lVar7;
  locale_ref loc;
  locale_ref in_R9;
  write_int_arg<unsigned_long> wVar8;
  write_int_arg<unsigned_long> arg_02;
  format_specs specs_00;
  format_specs specs_01;
  basic_string_view<char> s;
  longlong in_stack_fffffffffffff7b8;
  undefined2 in_stack_fffffffffffff7c0;
  undefined6 in_stack_fffffffffffff7c2;
  arg_formatter<char> local_790;
  undefined1 local_778 [8];
  dynamic_format_specs<char> specs;
  basic_format_arg<fmt::v11::context> arg;
  char *end_local;
  char *begin_local;
  int id_local;
  format_handler<char> *this_local;
  monostate local_6f9 [17];
  custom_value<fmt::v11::context> local_6e8;
  basic_string_view<char> local_6d8;
  uint128_opt *local_6c8;
  uint128_opt *local_6b8;
  detail *local_698;
  detail *local_688;
  arg_formatter<char> *local_668;
  string_value<char> *local_660;
  void *local_650;
  buffer<char> *local_648;
  arg_formatter<char> *local_638;
  write_int_arg<unsigned_int> local_630;
  basic_appender<char> local_628;
  void *local_620;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_618;
  size_t *local_608;
  undefined8 local_600;
  appender local_5f8;
  buffer<char> *local_5f0;
  int local_5e4;
  locale_ref local_5e0;
  buffer<char> *local_5d8;
  void *local_5c0;
  buffer<char> *local_5b8;
  arg_formatter<char> *local_5a8;
  void *local_598;
  buffer<char> *local_590;
  arg_formatter<char> *local_580;
  void *local_570;
  buffer<char> *local_568;
  arg_formatter<char> *local_558;
  detail *local_548;
  buffer<char> *local_538;
  buffer<char> *local_530;
  detail *local_528;
  arg_formatter<char> *local_510;
  detail *local_508;
  uint128_opt *local_4e8;
  buffer<char> *local_4d8;
  buffer<char> *local_4d0;
  uint128_opt *local_4c8;
  arg_formatter<char> *local_4b0;
  uint128_opt *local_4a8;
  void *local_488;
  buffer<char> *local_480;
  undefined1 local_471;
  arg_formatter<char> *local_470;
  void *local_460;
  buffer<char> *local_458;
  undefined1 local_449;
  arg_formatter<char> *local_448;
  void *local_438;
  buffer<char> *local_430;
  basic_specs local_428;
  buffer<char> *local_420;
  arg_formatter<char> *local_410;
  void *local_400;
  buffer<char> *local_3f8;
  basic_specs local_3f0;
  buffer<char> *local_3e8;
  arg_formatter<char> *local_3d8;
  void *local_3c8;
  char *local_3c0;
  size_t local_3b8;
  buffer<char> *local_3b0;
  arg_formatter<char> *local_398;
  void *local_388;
  buffer<char> *local_380;
  arg_formatter<char> *local_370;
  format_specs *local_360;
  buffer<char> *local_358;
  char *local_350;
  buffer<char> *local_348;
  arg_formatter<char> *local_340;
  buffer<char> *local_338;
  char *local_330;
  void *local_320;
  buffer<char> *local_318;
  arg_formatter<char> *local_308;
  void *local_2f8;
  char *local_2f0;
  size_t local_2e8;
  buffer<char> *local_2e0;
  arg_formatter<char> *local_2d8;
  write_int_arg<unsigned_int> local_2d0;
  basic_appender<char> local_2c8;
  void *local_2c0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_2b8;
  size_t *local_2a8;
  undefined8 local_2a0;
  appender local_298;
  buffer<char> *local_290;
  uint local_284;
  locale_ref local_280;
  buffer<char> *local_278;
  buffer<char> *local_268;
  uint local_260;
  buffer<char> *local_258;
  void *local_250;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_248;
  size_t *local_238;
  undefined8 local_230;
  appender local_228;
  buffer<char> *local_220;
  size_t *local_218;
  locale_ref local_210;
  buffer<char> *local_208;
  buffer<char> *local_1f8;
  uint local_1f0;
  buffer<char> *local_1e8;
  void *local_1e0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_1d8;
  size_t *local_1c8;
  undefined8 local_1c0;
  appender local_1b8;
  buffer<char> *local_1b0;
  size_t *local_1a8;
  locale_ref local_1a0;
  buffer<char> *local_198;
  detail *local_188;
  undefined8 local_180;
  write_int_arg<unsigned___int128> local_178;
  basic_appender<char> local_158;
  void *local_150;
  detail *local_148;
  undefined8 local_140;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_138;
  detail *local_128;
  undefined8 local_120;
  appender local_118;
  buffer<char> *local_110;
  detail *local_108;
  undefined8 local_100;
  locale_ref local_f0;
  detail *local_e8;
  buffer<char> *local_d8;
  uint128_opt *local_c8;
  undefined8 local_c0;
  write_int_arg<unsigned___int128> local_b8;
  basic_appender<char> local_98;
  void *local_90;
  uint128_opt *local_88;
  undefined8 local_80;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_78;
  uint128_opt *local_68;
  undefined8 local_60;
  appender local_58;
  buffer<char> *local_50;
  uint128_opt *local_48;
  undefined8 local_40;
  locale_ref local_30;
  uint128_opt *local_28;
  buffer<char> *local_18;
  
  get_arg<fmt::v11::context,int>
            ((basic_format_arg<fmt::v11::context> *)((long)&specs.precision_ref + 8),
             (detail *)&this->ctx,(context *)(ulong)(uint)id,(int)end);
  bVar1 = basic_format_arg<fmt::v11::context>::format_custom
                    ((basic_format_arg<fmt::v11::context> *)((long)&specs.precision_ref + 8),begin,
                     &this->parse_ctx,&this->ctx);
  if (bVar1) {
    this_local = (format_handler<char> *)parse_context<char>::begin(&this->parse_ctx);
  }
  else {
    memset(local_778,0,0x30);
    dynamic_format_specs<char>::dynamic_format_specs((dynamic_format_specs<char> *)local_778);
    arg_type = basic_format_arg<fmt::v11::context>::type
                         ((basic_format_arg<fmt::v11::context> *)((long)&specs.precision_ref + 8));
    loc.locale_ = (void *)(ulong)arg_type;
    this_local = (format_handler<char> *)
                 parse_format_specs<char>
                           (begin,end,(dynamic_format_specs<char> *)local_778,&this->parse_ctx,
                            arg_type);
    bVar1 = basic_specs::dynamic((basic_specs *)local_778);
    if (bVar1) {
      aVar2 = basic_specs::dynamic_width((basic_specs *)local_778);
      handle_dynamic_spec<fmt::v11::context>
                (aVar2,(int *)&specs,(arg_ref<char> *)&specs.super_format_specs.width,&this->ctx);
      aVar2 = basic_specs::dynamic_precision((basic_specs *)local_778);
      handle_dynamic_spec<fmt::v11::context>
                (aVar2,(int *)specs.super_format_specs.super_basic_specs.fill_data_,
                 (arg_ref<char> *)((long)&specs.width_ref + 8),&this->ctx);
    }
    local_790.out.container = (buffer<char> *)v11::context::out(&this->ctx);
    local_790.specs = (format_specs *)local_778;
    local_790.locale = v11::context::locale(&this->ctx);
    local_660 = (string_value<char> *)((long)&specs.precision_ref + 8);
    local_668 = &local_790;
    switch(arg.value_.field_0.int128_value._8_4_) {
    case 0:
    default:
      monostate::monostate(local_6f9);
      local_2e0 = local_790.out.container;
      local_2f0 = *(char **)&(local_790.specs)->super_basic_specs;
      local_2e8 = *(size_t *)&(local_790.specs)->width;
      local_2f8 = local_790.locale.locale_;
      local_2d8 = &local_790;
      write<char,fmt::v11::basic_appender<char>>
                (local_790.out.container,local_2f0,local_2e8,local_790.locale.locale_);
      break;
    case 1:
      local_5e4 = specs.precision_ref.name.size_._0_4_;
      local_648 = local_790.out.container;
      psVar4 = (size_t *)(ulong)(uint)specs.precision_ref.name.size_._0_4_;
      local_5f0 = (buffer<char> *)local_790.specs;
      bVar6.container = local_790.out.container;
      local_650 = local_790.locale.locale_;
      local_638 = &local_790;
      local_5e0 = local_790.locale;
      local_5d8 = local_648;
      bVar1 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar5 = extraout_RDX;
      if (bVar1) {
        local_5f8.container = local_5d8;
        loc_value::loc_value<int,_0>((loc_value *)&local_618.string,local_5e4);
        local_620 = local_5e0.locale_;
        value_03.value_.value_.field_0.int128_value._8_2_ = (short)local_618.string.size;
        value_03.value_.value_.field_0.long_long_value = local_618.long_long_value;
        value_03.value_.value_.field_0.int128_value._10_6_ = (int6)((ulong)local_618._8_8_ >> 0x10);
        value_03.value_._16_8_ = local_608;
        value_03.value_._24_8_ = local_600;
        bVar6.container = local_5f0;
        bVar1 = write_loc(local_5f8,value_03,(format_specs *)local_5f0,local_5e0);
        psVar4 = local_608;
        puVar5 = extraout_RDX_00;
        if (bVar1) {
          return (char *)this_local;
        }
      }
      local_628.container = local_5d8;
      sVar3 = basic_specs::sign((basic_specs *)local_5f0,(EVP_PKEY_CTX *)bVar6.container,puVar5,
                                psVar4,(uchar *)loc.locale_,(size_t)in_R9.locale_);
      local_630 = make_write_int_arg<int>(local_5e4,sVar3);
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
                (local_628,local_630,(format_specs *)local_5f0);
      break;
    case 2:
      local_284 = specs.precision_ref.name.size_._0_4_;
      local_5b8 = local_790.out.container;
      psVar4 = (size_t *)(ulong)(uint)specs.precision_ref.name.size_._0_4_;
      local_290 = (buffer<char> *)local_790.specs;
      bVar6.container = local_790.out.container;
      local_5c0 = local_790.locale.locale_;
      local_5a8 = &local_790;
      local_280 = local_790.locale;
      local_278 = local_5b8;
      bVar1 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar5 = extraout_RDX_01;
      if (bVar1) {
        local_298.container = local_278;
        loc_value::loc_value<unsigned_int,_0>((loc_value *)&local_2b8.string,local_284);
        local_2c0 = local_280.locale_;
        value_04.value_.value_.field_0.int128_value._8_2_ = (short)local_2b8.string.size;
        value_04.value_.value_.field_0.long_long_value = local_2b8.long_long_value;
        value_04.value_.value_.field_0.int128_value._10_6_ = (int6)((ulong)local_2b8._8_8_ >> 0x10);
        value_04.value_._16_8_ = local_2a8;
        value_04.value_._24_8_ = local_2a0;
        bVar6.container = local_290;
        bVar1 = write_loc(local_298,value_04,(format_specs *)local_290,local_280);
        psVar4 = local_2a8;
        puVar5 = extraout_RDX_02;
        if (bVar1) {
          return (char *)this_local;
        }
      }
      local_2c8.container = local_278;
      sVar3 = basic_specs::sign((basic_specs *)local_290,(EVP_PKEY_CTX *)bVar6.container,puVar5,
                                psVar4,(uchar *)loc.locale_,(size_t)in_R9.locale_);
      local_2d0 = make_write_int_arg<unsigned_int>(local_284,sVar3);
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
                (local_2c8,local_2d0,(format_specs *)local_290);
      break;
    case 3:
      psVar4 = (size_t *)
               CONCAT44(specs.precision_ref.name.size_._4_4_,specs.precision_ref.name.size_._0_4_);
      local_590 = local_790.out.container;
      local_220 = (buffer<char> *)local_790.specs;
      bVar6.container = local_790.out.container;
      local_598 = local_790.locale.locale_;
      local_580 = &local_790;
      local_218 = psVar4;
      local_210 = local_790.locale;
      local_208 = local_590;
      bVar1 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar5 = extraout_RDX_03;
      if (bVar1) {
        local_228.container = local_208;
        loc_value::loc_value<long_long,_0>((loc_value *)&local_248.string,(longlong)local_218);
        local_250 = local_210.locale_;
        value_05.value_.value_.field_0.int128_value._8_2_ = (short)local_248.string.size;
        value_05.value_.value_.field_0.long_long_value = local_248.long_long_value;
        value_05.value_.value_.field_0.int128_value._10_6_ = (int6)((ulong)local_248._8_8_ >> 0x10);
        value_05.value_._16_8_ = local_238;
        value_05.value_._24_8_ = local_230;
        bVar6.container = local_220;
        bVar1 = write_loc(local_228,value_05,(format_specs *)local_220,local_210);
        psVar4 = local_238;
        puVar5 = extraout_RDX_04;
        if (bVar1) {
          return (char *)this_local;
        }
      }
      local_258 = local_208;
      sVar3 = basic_specs::sign((basic_specs *)local_220,(EVP_PKEY_CTX *)bVar6.container,puVar5,
                                psVar4,(uchar *)loc.locale_,(size_t)in_R9.locale_);
      wVar8 = make_write_int_arg<long_long>((longlong)local_218,sVar3);
      local_268 = (buffer<char> *)wVar8.abs_value;
      local_260 = wVar8.prefix;
      arg_02.abs_value = (ulong)local_260;
      arg_02._8_8_ = local_220;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
                ((detail *)local_258,(basic_appender<char>)local_268,arg_02,
                 (format_specs *)loc.locale_);
      break;
    case 4:
      psVar4 = (size_t *)
               CONCAT44(specs.precision_ref.name.size_._4_4_,specs.precision_ref.name.size_._0_4_);
      local_568 = local_790.out.container;
      local_1b0 = (buffer<char> *)local_790.specs;
      bVar6.container = local_790.out.container;
      local_570 = local_790.locale.locale_;
      local_558 = &local_790;
      local_1a8 = psVar4;
      local_1a0 = local_790.locale;
      local_198 = local_568;
      bVar1 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar5 = extraout_RDX_05;
      if (bVar1) {
        local_1b8.container = local_198;
        loc_value::loc_value<unsigned_long_long,_0>
                  ((loc_value *)&local_1d8.string,(unsigned_long_long)local_1a8);
        local_1e0 = local_1a0.locale_;
        value_06.value_.value_.field_0.int128_value._8_2_ = (short)local_1d8.string.size;
        value_06.value_.value_.field_0.long_long_value = local_1d8.long_long_value;
        value_06.value_.value_.field_0.int128_value._10_6_ = (int6)((ulong)local_1d8._8_8_ >> 0x10);
        value_06.value_._16_8_ = local_1c8;
        value_06.value_._24_8_ = local_1c0;
        bVar6.container = local_1b0;
        bVar1 = write_loc(local_1b8,value_06,(format_specs *)local_1b0,local_1a0);
        psVar4 = local_1c8;
        puVar5 = extraout_RDX_06;
        if (bVar1) {
          return (char *)this_local;
        }
      }
      local_1e8 = local_198;
      sVar3 = basic_specs::sign((basic_specs *)local_1b0,(EVP_PKEY_CTX *)bVar6.container,puVar5,
                                psVar4,(uchar *)loc.locale_,(size_t)in_R9.locale_);
      wVar8 = make_write_int_arg<unsigned_long_long>((unsigned_long_long)local_1a8,sVar3);
      local_1f8 = (buffer<char> *)wVar8.abs_value;
      local_1f0 = wVar8.prefix;
      wVar8.abs_value = (ulong)local_1f0;
      wVar8._8_8_ = local_1b0;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
                ((detail *)local_1e8,(basic_appender<char>)local_1f8,wVar8,
                 (format_specs *)loc.locale_);
      break;
    case 5:
      x._8_2_ = in_stack_fffffffffffff7c0;
      x._0_8_ = in_stack_fffffffffffff7b8;
      x._10_6_ = in_stack_fffffffffffff7c2;
      siglen = (detail *)
               detail::map((int128_opt *)
                           CONCAT44(specs.precision_ref.name.size_._4_4_,
                                    specs.precision_ref.name.size_._0_4_),(int128_opt)x);
      local_530 = local_790.out.container;
      local_110 = (buffer<char> *)local_790.specs;
      local_538 = (buffer<char> *)local_790.locale.locale_;
      lVar7.locale_ = local_790.locale.locale_;
      local_698 = siglen;
      local_688 = siglen;
      local_548 = siglen;
      local_528 = siglen;
      local_510 = &local_790;
      local_508 = siglen;
      local_108 = siglen;
      local_100 = extraout_RDX_07;
      local_f0.locale_ = local_538;
      local_e8 = siglen;
      local_d8 = local_530;
      bVar1 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar5 = extraout_RDX_08;
      if (bVar1) {
        local_118.container = local_d8;
        local_140 = local_100;
        local_148 = local_108;
        value._8_2_ = in_stack_fffffffffffff7c0;
        value._0_8_ = in_stack_fffffffffffff7b8;
        value._10_6_ = in_stack_fffffffffffff7c2;
        loc_value::loc_value<__int128,_0>((loc_value *)&local_138.string,(__int128)value);
        local_150 = local_f0.locale_;
        in_stack_fffffffffffff7c0 = (undefined2)local_138.string.size;
        in_stack_fffffffffffff7c2 = (undefined6)((ulong)local_138._8_8_ >> 0x10);
        value_07.value_.value_.field_0.int128_value._8_2_ = in_stack_fffffffffffff7c0;
        value_07.value_.value_.field_0.long_long_value = local_138.long_long_value;
        value_07.value_.value_.field_0.int128_value._10_6_ = in_stack_fffffffffffff7c2;
        value_07.value_._16_8_ = local_128;
        value_07.value_._24_8_ = local_120;
        lVar7.locale_ = local_110;
        bVar1 = write_loc(local_118,value_07,(format_specs *)local_110,local_f0);
        siglen = local_128;
        puVar5 = extraout_RDX_09;
        in_stack_fffffffffffff7b8 = local_138.long_long_value;
        if (bVar1) {
          return (char *)this_local;
        }
      }
      this_00 = local_108;
      local_158.container = local_d8;
      basic_specs::sign((basic_specs *)local_110,(EVP_PKEY_CTX *)lVar7.locale_,puVar5,
                        (size_t *)siglen,(uchar *)loc.locale_,(size_t)in_R9.locale_);
      local_180 = local_100;
      local_188 = this_00;
      value_00._8_2_ = in_stack_fffffffffffff7c0;
      value_00._0_8_ = in_stack_fffffffffffff7b8;
      value_00._10_6_ = in_stack_fffffffffffff7c2;
      make_write_int_arg<__int128>(&local_178,this_00,(__int128)value_00,(sign)local_100);
      arg_00.abs_value._8_2_ = (short)local_178.abs_value._8_8_;
      arg_00.abs_value._0_8_ = (undefined8)local_178.abs_value;
      arg_00.abs_value._10_6_ = (int6)((ulong)local_178.abs_value._8_8_ >> 0x10);
      arg_00.prefix = local_178.prefix;
      arg_00._20_4_ = local_178._20_4_;
      arg_00._24_8_ = local_178._24_8_;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
                (local_158,arg_00,(format_specs *)local_110);
      break;
    case 6:
      x_00._8_2_ = in_stack_fffffffffffff7c0;
      x_00._0_8_ = in_stack_fffffffffffff7b8;
      x_00._10_6_ = in_stack_fffffffffffff7c2;
      siglen_00 = detail::map((uint128_opt *)
                              CONCAT44(specs.precision_ref.name.size_._4_4_,
                                       specs.precision_ref.name.size_._0_4_),(uint128_opt)x_00);
      local_4d0 = local_790.out.container;
      local_50 = (buffer<char> *)local_790.specs;
      local_4d8 = (buffer<char> *)local_790.locale.locale_;
      lVar7.locale_ = local_790.locale.locale_;
      local_6c8 = siglen_00;
      local_6b8 = siglen_00;
      local_4e8 = siglen_00;
      local_4c8 = siglen_00;
      local_4b0 = &local_790;
      local_4a8 = siglen_00;
      local_48 = siglen_00;
      local_40 = extraout_RDX_10;
      local_30.locale_ = local_4d8;
      local_28 = siglen_00;
      local_18 = local_4d0;
      bVar1 = basic_specs::localized(&(local_790.specs)->super_basic_specs);
      puVar5 = extraout_RDX_11;
      if (bVar1) {
        local_58.container = local_18;
        local_80 = local_40;
        local_88 = local_48;
        value_01._8_2_ = in_stack_fffffffffffff7c0;
        value_01._0_8_ = in_stack_fffffffffffff7b8;
        value_01._10_6_ = in_stack_fffffffffffff7c2;
        loc_value::loc_value<unsigned___int128,_0>
                  ((loc_value *)&local_78.string,(unsigned___int128)value_01);
        local_90 = local_30.locale_;
        in_stack_fffffffffffff7c0 = (undefined2)local_78.string.size;
        in_stack_fffffffffffff7c2 = (undefined6)((ulong)local_78._8_8_ >> 0x10);
        value_08.value_.value_.field_0.int128_value._8_2_ = in_stack_fffffffffffff7c0;
        value_08.value_.value_.field_0.long_long_value = local_78.long_long_value;
        value_08.value_.value_.field_0.int128_value._10_6_ = in_stack_fffffffffffff7c2;
        value_08.value_._16_8_ = local_68;
        value_08.value_._24_8_ = local_60;
        lVar7.locale_ = local_50;
        bVar1 = write_loc(local_58,value_08,(format_specs *)local_50,local_30);
        siglen_00 = local_68;
        puVar5 = extraout_RDX_12;
        in_stack_fffffffffffff7b8 = local_78.long_long_value;
        if (bVar1) {
          return (char *)this_local;
        }
      }
      this_01 = local_48;
      local_98.container = local_18;
      basic_specs::sign((basic_specs *)local_50,(EVP_PKEY_CTX *)lVar7.locale_,puVar5,
                        (size_t *)siglen_00,(uchar *)loc.locale_,(size_t)in_R9.locale_);
      local_c0 = local_40;
      local_c8 = this_01;
      value_02._8_2_ = in_stack_fffffffffffff7c0;
      value_02._0_8_ = in_stack_fffffffffffff7b8;
      value_02._10_6_ = in_stack_fffffffffffff7c2;
      write_int_arg<std::
      conditional<(((num_bits<unsigned__int128>)())<=(32))&&(!(0)),unsigned_int,std::
      conditional<((num_bits<unsigned__int128>)())<=(64),unsigned_long,unsigned__int128>::type>::
      type>fmt::v11::detail::make_write_int_arg<unsigned__int128>
                (&local_b8,this_01,(unsigned___int128)value_02,(sign)local_40);
      arg_01.abs_value._8_2_ = (short)local_b8.abs_value._8_8_;
      arg_01.abs_value._0_8_ = (undefined8)local_b8.abs_value;
      arg_01.abs_value._10_6_ = (int6)((ulong)local_b8.abs_value._8_8_ >> 0x10);
      arg_01.prefix = local_b8.prefix;
      arg_01._20_4_ = local_b8._20_4_;
      arg_01._24_8_ = local_b8._24_8_;
      write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
                (local_98,arg_01,(format_specs *)local_50);
      break;
    case 7:
      local_471 = specs.precision_ref.name.size_._0_1_ & 1;
      local_480 = local_790.out.container;
      local_488 = local_790.locale.locale_;
      local_470 = &local_790;
      write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                (local_790.out,(bool)local_471,local_790.specs,local_790.locale);
      break;
    case 8:
      local_449 = specs.precision_ref.name.size_._0_1_;
      local_458 = local_790.out.container;
      local_460 = local_790.locale.locale_;
      local_448 = &local_790;
      write<char,fmt::v11::basic_appender<char>>
                (local_790.out,specs.precision_ref.name.size_._0_1_,local_790.specs,local_790.locale
                );
      break;
    case 9:
      local_420 = local_790.out.container;
      local_430 = *(buffer<char> **)&(local_790.specs)->super_basic_specs;
      local_428 = *(basic_specs *)&(local_790.specs)->width;
      specs_00._8_8_ = local_790.locale.locale_;
      specs_00.super_basic_specs = local_428;
      local_438 = local_790.locale.locale_;
      local_410 = &local_790;
      write<char,_fmt::v11::basic_appender<char>,_float,_0>
                ((detail *)local_790.out.container,(basic_appender<char>)local_430,
                 (float)specs.precision_ref.name.size_._0_4_,specs_00,loc);
      break;
    case 10:
      local_3e8 = local_790.out.container;
      local_3f8 = *(buffer<char> **)&(local_790.specs)->super_basic_specs;
      local_3f0 = *(basic_specs *)&(local_790.specs)->width;
      specs_01._8_8_ = local_790.locale.locale_;
      specs_01.super_basic_specs = local_3f0;
      local_400 = local_790.locale.locale_;
      local_3d8 = &local_790;
      write<char,_fmt::v11::basic_appender<char>,_double,_0>
                ((detail *)local_790.out.container,(basic_appender<char>)local_3f8,
                 (double)CONCAT44(specs.precision_ref.name.size_._4_4_,
                                  specs.precision_ref.name.size_._0_4_),specs_01,loc);
      break;
    case 0xb:
      local_3b0 = local_790.out.container;
      local_3c0 = *(char **)&(local_790.specs)->super_basic_specs;
      local_3b8 = *(size_t *)&(local_790.specs)->width;
      local_3c8 = local_790.locale.locale_;
      local_398 = &local_790;
      write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
                (local_790.out,
                 (longdouble)
                 CONCAT28(arg.value_.field_0.int_value._0_2_,
                          CONCAT44(specs.precision_ref.name.size_._4_4_,
                                   specs.precision_ref.name.size_._0_4_)),*local_790.specs,
                 local_790.locale);
      break;
    case 0xc:
      local_380 = local_790.out.container;
      local_388 = local_790.locale.locale_;
      local_370 = &local_790;
      write<char,fmt::v11::basic_appender<char>>
                (local_790.out,
                 (char *)CONCAT44(specs.precision_ref.name.size_._4_4_,
                                  specs.precision_ref.name.size_._0_4_),local_790.specs,
                 local_790.locale);
      break;
    case 0xd:
      local_6d8 = string_value<char>::str(local_660);
      local_338 = (buffer<char> *)local_6d8.data_;
      local_330 = (char *)local_6d8.size_;
      local_348 = local_790.out.container;
      local_358 = (buffer<char> *)local_6d8.data_;
      local_350 = (char *)local_6d8.size_;
      local_360 = (format_specs *)local_790.locale.locale_;
      s.size_ = (size_t)local_790.specs;
      s.data_ = (char *)local_6d8.size_;
      local_340 = &local_790;
      write<char,fmt::v11::basic_appender<char>>
                ((detail *)local_790.out.container,(basic_appender<char>)local_6d8.data_,s,
                 (format_specs *)local_790.locale.locale_,in_R9);
      break;
    case 0xe:
      local_318 = local_790.out.container;
      local_320 = local_790.locale.locale_;
      local_308 = &local_790;
      write<char,_fmt::v11::basic_appender<char>,_void,_0>
                (local_790.out,
                 (void *)CONCAT44(specs.precision_ref.name.size_._4_4_,
                                  specs.precision_ref.name.size_._0_4_),local_790.specs,
                 local_790.locale);
      break;
    case 0xf:
      custom.value._4_4_ = specs.precision_ref.name.size_._4_4_;
      custom.value._0_4_ = specs.precision_ref.name.size_._0_4_;
      custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
      custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
      basic_format_arg<fmt::v11::context>::handle::handle((handle *)&local_6e8,custom);
      arg_formatter<char>::operator()(&local_790,(handle)local_6e8);
    }
  }
  return (char *)this_local;
}

Assistant:

auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    auto arg = get_arg(ctx, id);
    // Not using a visitor for custom types gives better codegen.
    if (arg.format_custom(begin, parse_ctx, ctx)) return parse_ctx.begin();

    auto specs = dynamic_format_specs<Char>();
    begin = parse_format_specs(begin, end, specs, parse_ctx, arg.type());
    if (specs.dynamic()) {
      handle_dynamic_spec(specs.dynamic_width(), specs.width, specs.width_ref,
                          ctx);
      handle_dynamic_spec(specs.dynamic_precision(), specs.precision,
                          specs.precision_ref, ctx);
    }

    arg.visit(arg_formatter<Char>{ctx.out(), specs, ctx.locale()});
    return begin;
  }